

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall Catch::TagInfo::all_abi_cxx11_(string *__return_storage_ptr__,TagInfo *this)

{
  long *plVar1;
  _Base_ptr p_Var2;
  long *plVar3;
  _Rb_tree_header *p_Var4;
  long *local_78;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var2 = (this->spellings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->spellings)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    do {
      std::operator+(&local_50,"[",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var2 + 1));
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_68 = *plVar3;
        lStack_60 = plVar1[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar3;
        local_78 = (long *)*plVar1;
      }
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string all() const {
            std::string out;
            for( std::set<std::string>::const_iterator it = spellings.begin(), itEnd = spellings.end();
                        it != itEnd;
                        ++it )
                out += "[" + *it + "]";
            return out;
        }